

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O2

int Saig_StrSimDetectUnique(Aig_Man_t *p0,Aig_Man_t *p1)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  Aig_Obj_t **ppTable;
  Aig_Obj_t **ppNexts;
  void *__ptr;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t **ppAVar6;
  ulong uVar7;
  uint nTableSize;
  Vec_Ptr_t *p;
  int iVar8;
  ulong local_48;
  
  p = p0->vObjs;
  iVar3 = p->nSize;
  uVar7 = (long)(iVar3 - p0->nDeleted) / 2;
  local_48 = uVar7 & 0xffffffff;
  uVar2 = (int)uVar7 - 1;
  do {
    nTableSize = uVar2 + 1;
    if ((uVar2 & 1) == 0) {
      uVar7 = 3;
      do {
        iVar8 = (int)uVar7;
        if (nTableSize < (uint)(iVar8 * iVar8)) {
          ppTable = (Aig_Obj_t **)calloc((long)(int)nTableSize,8);
          ppNexts = (Aig_Obj_t **)calloc((long)iVar3,8);
          __ptr = calloc((long)iVar3,8);
          for (iVar8 = 0; iVar8 < iVar3; iVar8 = iVar8 + 1) {
            pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p,iVar8);
            if (((pAVar4 != (Aig_Obj_t *)0x0) &&
                ((uVar2 = (uint)*(undefined8 *)&pAVar4->field_0x18, (uVar2 & 7) == 2 ||
                 (0xfffffffd < (uVar2 & 7) - 7)))) &&
               ((p0->pReprs == (Aig_Obj_t **)0x0 || (p0->pReprs[pAVar4->Id] == (Aig_Obj_t *)0x0))))
            {
              iVar3 = Saig_StrSimIsZero(pAVar4);
              if (iVar3 == 0) {
                iVar3 = Saig_StrSimIsOne(pAVar4);
                if (iVar3 == 0) {
                  pAVar5 = Saig_StrSimTableLookup(ppTable,ppNexts,nTableSize,pAVar4);
                  if (pAVar5 == (Aig_Obj_t *)0x0) {
                    Saig_StrSimTableInsert(ppTable,ppNexts,nTableSize,pAVar4);
                  }
                  else {
                    pAVar5->field_0x18 = pAVar5->field_0x18 | 0x10;
                  }
                }
              }
            }
            p = p0->vObjs;
            iVar3 = p->nSize;
          }
          for (iVar3 = 0; iVar3 < p1->vObjs->nSize; iVar3 = iVar3 + 1) {
            pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p1->vObjs,iVar3);
            if (((pAVar4 != (Aig_Obj_t *)0x0) &&
                ((uVar2 = (uint)*(undefined8 *)&pAVar4->field_0x18, (uVar2 & 7) == 2 ||
                 (0xfffffffd < (uVar2 & 7) - 7)))) &&
               ((p1->pReprs == (Aig_Obj_t **)0x0 || (p1->pReprs[pAVar4->Id] == (Aig_Obj_t *)0x0))))
            {
              iVar8 = Saig_StrSimIsZero(pAVar4);
              if (iVar8 == 0) {
                iVar8 = Saig_StrSimIsOne(pAVar4);
                if (iVar8 == 0) {
                  pAVar5 = Saig_StrSimTableLookup(ppTable,ppNexts,nTableSize,pAVar4);
                  if (pAVar5 != (Aig_Obj_t *)0x0) {
                    if (*(long *)((long)__ptr + (long)pAVar5->Id * 8) == 0) {
                      *(Aig_Obj_t **)((long)__ptr + (long)pAVar5->Id * 8) = pAVar4;
                    }
                    else {
                      pAVar5->field_0x18 = pAVar5->field_0x18 | 0x10;
                    }
                  }
                }
              }
            }
          }
          uVar7 = 0;
          if ((int)local_48 < 1) {
            local_48 = uVar7;
          }
          iVar3 = 0;
          for (; uVar7 != local_48; uVar7 = uVar7 + 1) {
            ppAVar6 = ppTable + uVar7;
            while (pAVar4 = *ppAVar6, pAVar4 != (Aig_Obj_t *)0x0) {
              if ((((*(ulong *)&pAVar4->field_0x18 & 0x10) == 0) &&
                  (pAVar5 = *(Aig_Obj_t **)((long)__ptr + (long)pAVar4->Id * 8),
                  pAVar5 != (Aig_Obj_t *)0x0)) &&
                 ((((uint)*(ulong *)&pAVar4->field_0x18 ^ *(uint *)&pAVar5->field_0x18) & 7) == 0))
              {
                Aig_ObjSetRepr(p0,pAVar4,pAVar5);
                Aig_ObjSetRepr(p1,pAVar5,pAVar4);
                iVar3 = iVar3 + 1;
              }
              ppAVar6 = ppNexts + pAVar4->Id;
            }
          }
          Aig_ManCleanMarkA(p0);
          free(ppTable);
          free(ppNexts);
          free(__ptr);
          return iVar3;
        }
        uVar1 = (ulong)nTableSize % uVar7;
        uVar7 = (ulong)(iVar8 + 2);
      } while ((int)uVar1 != 0);
    }
    local_48 = (ulong)((int)local_48 + 1);
    uVar2 = nTableSize;
  } while( true );
}

Assistant:

int Saig_StrSimDetectUnique( Aig_Man_t * p0, Aig_Man_t * p1 )
{
    Aig_Obj_t ** ppTable, ** ppNexts, ** ppCands;
    Aig_Obj_t * pObj, * pEntry;
    int i, nTableSize, Counter;

    // allocate the hash table hashing simulation info into nodes
    nTableSize = Abc_PrimeCudd( Aig_ManObjNum(p0)/2 );
    ppTable = ABC_CALLOC( Aig_Obj_t *, nTableSize );
    ppNexts = ABC_CALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p0) );
    ppCands = ABC_CALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p0) );

    // hash nodes of the first AIG
    Aig_ManForEachObj( p0, pObj, i )
    {
        if ( !Aig_ObjIsCi(pObj) && !Aig_ObjIsNode(pObj) )
            continue;
        if ( Aig_ObjRepr(p0, pObj) )
            continue;
        if ( Saig_StrSimIsZero(pObj) || Saig_StrSimIsOne(pObj) )
            continue;
        // check if the entry exists
        pEntry = Saig_StrSimTableLookup( ppTable, ppNexts, nTableSize, pObj );
        if ( pEntry == NULL ) // insert
            Saig_StrSimTableInsert( ppTable, ppNexts, nTableSize, pObj );
        else // mark the entry as not unique
            pEntry->fMarkA = 1;
    }

    // hash nodes from the second AIG
    Aig_ManForEachObj( p1, pObj, i )
    {
        if ( !Aig_ObjIsCi(pObj) && !Aig_ObjIsNode(pObj) )
            continue;
        if ( Aig_ObjRepr(p1, pObj) )
            continue;
        if ( Saig_StrSimIsZero(pObj) || Saig_StrSimIsOne(pObj) )
            continue;
        // check if the entry exists
        pEntry = Saig_StrSimTableLookup( ppTable, ppNexts, nTableSize, pObj );
        if ( pEntry == NULL ) // skip
            continue;
        // if there is no candidate, label it
        if ( Saig_ObjNext( ppCands, pEntry ) == NULL )
            Saig_ObjSetNext( ppCands, pEntry, pObj );
        else // mark the entry as not unique
            pEntry->fMarkA = 1;
    }

    // create representatives for the unique entries
    Counter = 0;
    for ( i = 0; i < nTableSize; i++ )
        for ( pEntry = ppTable[i]; pEntry; pEntry = Saig_ObjNext(ppNexts,pEntry) )
            if ( !pEntry->fMarkA && (pObj = Saig_ObjNext( ppCands, pEntry )) )
            {
//                assert( Aig_ObjIsNode(pEntry) == Aig_ObjIsNode(pObj) );
                if ( Aig_ObjType(pEntry) != Aig_ObjType(pObj) )
                    continue;
                Aig_ObjSetRepr( p0, pEntry, pObj );
                Aig_ObjSetRepr( p1, pObj, pEntry );
                Counter++;
            }

    // cleanup
    Aig_ManCleanMarkA( p0 );
    ABC_FREE( ppTable );
    ABC_FREE( ppNexts );
    ABC_FREE( ppCands );
    return Counter;
}